

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test *this_00;
  
  this_00 = (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0xee);
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test::
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 4);
    char* mem2 = detector->allocMemory(testAllocator, 12);
    detector->deallocMemory(testAllocator, mem);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(output.contains("Leak size: 12"));
    CHECK(!output.contains("Leak size: 4"));
    PlatformSpecificFree(mem2);
    LONGS_EQUAL(2, testAllocator->alloc_called);
    LONGS_EQUAL(1, testAllocator->free_called);
}